

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::FragmentShader::shadeFragments
          (FragmentShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  int iVar1;
  TextureChannelClass TVar2;
  uint uVar3;
  TextureFormat *pTVar4;
  uint uVar5;
  uint uVar6;
  float fVar7;
  undefined1 local_a8 [8];
  IVec4 color_2;
  UVec4 color_1;
  Vec4 color;
  float values [4];
  VecAccess local_44 [8];
  Vec2 vColor;
  int fragNdx;
  FragmentPacket *packet;
  int packetNdx;
  FragmentShadingContext *context_local;
  int numPackets_local;
  FragmentPacket *packets_local;
  FragmentShader *this_local;
  
  for (packet._4_4_ = 0; packet._4_4_ < numPackets; packet._4_4_ = packet._4_4_ + 1) {
    register0x00000000 = packets + packet._4_4_;
    for (vColor.m_data[0] = 0.0; (int)vColor.m_data[0] < 4;
        vColor.m_data[0] = (float)((int)vColor.m_data[0] + 1)) {
      rr::readVarying<float>
                ((rr *)(values + 2),stack0xffffffffffffffc8,context,0,(int)vColor.m_data[0]);
      tcu::Vector<float,_4>::xy((Vector<float,_4> *)(values + 2));
      tcu::VecAccess::operator_cast_to_Vector(local_44);
      color.m_data[2] = tcu::Vector<float,_2>::x((Vector<float,_2> *)local_44);
      color.m_data[3] = tcu::Vector<float,_2>::y((Vector<float,_2> *)local_44);
      fVar7 = tcu::Vector<float,_2>::x((Vector<float,_2> *)local_44);
      values[0] = 1.0 - fVar7;
      fVar7 = tcu::Vector<float,_2>::y((Vector<float,_2> *)local_44);
      values[1] = 1.0 - fVar7;
      pTVar4 = DrawBufferInfo::getFormat(&this->m_info);
      TVar2 = tcu::getTextureChannelClass(pTVar4->type);
      switch(TVar2) {
      case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
      case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
      case TEXTURECHANNELCLASS_FLOATING_POINT:
        tcu::Vector<float,_4>::Vector
                  ((Vector<float,_4> *)(color_1.m_data + 2),
                   color.m_data[(long)(this->m_drawBufferNdx % 4) + 2],
                   color.m_data[(long)((this->m_drawBufferNdx + 1) % 4) + 2],
                   color.m_data[(long)((this->m_drawBufferNdx + 2) % 4) + 2],
                   color.m_data[(long)((this->m_drawBufferNdx + 3) % 4) + 2]);
        rr::writeFragmentOutput<tcu::Vector<float,4>>
                  (context,packet._4_4_,(int)vColor.m_data[0],0,
                   (Vector<float,_4> *)(color_1.m_data + 2));
        break;
      case TEXTURECHANNELCLASS_SIGNED_INTEGER:
        tcu::Vector<int,_4>::Vector
                  ((Vector<int,_4> *)local_a8,
                   (int)color.m_data[(long)(this->m_drawBufferNdx % 4) + 2],
                   (int)color.m_data[(long)((this->m_drawBufferNdx + 1) % 4) + 2],
                   (int)color.m_data[(long)((this->m_drawBufferNdx + 2) % 4) + 2],
                   (int)color.m_data[(long)((this->m_drawBufferNdx + 3) % 4) + 2]);
        rr::writeFragmentOutput<tcu::Vector<int,4>>
                  (context,packet._4_4_,(int)vColor.m_data[0],0,(Vector<int,_4> *)local_a8);
        break;
      case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
        iVar1 = this->m_drawBufferNdx;
        uVar3 = iVar1 + 1U;
        if ((int)(iVar1 + 1U) < 0) {
          uVar3 = iVar1 + 4;
        }
        uVar6 = iVar1 + 2U;
        if ((int)(iVar1 + 2U) < 0) {
          uVar6 = iVar1 + 5;
        }
        uVar5 = iVar1 + 3U;
        if ((int)(iVar1 + 3U) < 0) {
          uVar5 = iVar1 + 6;
        }
        tcu::Vector<unsigned_int,_4>::Vector
                  ((Vector<unsigned_int,_4> *)(color_2.m_data + 2),
                   (uint)(long)color.m_data[(long)(iVar1 % 4) + 2],
                   (uint)(long)color.m_data[(long)(int)((iVar1 + 1) - (uVar3 & 0xfffffffc)) + 2],
                   (uint)(long)color.m_data[(long)(int)((iVar1 + 2) - (uVar6 & 0xfffffffc)) + 2],
                   (uint)(long)color.m_data[(long)(int)((iVar1 + 3) - (uVar5 & 0xfffffffc)) + 2]);
        rr::writeFragmentOutput<tcu::Vector<unsigned_int,4>>
                  (context,packet._4_4_,(int)vColor.m_data[0],0,
                   (Vector<unsigned_int,_4> *)(color_2.m_data + 2));
      }
    }
  }
  return;
}

Assistant:

void FragmentShader::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		rr::FragmentPacket& packet = packets[packetNdx];

		DE_ASSERT(m_drawBufferNdx >= 0);
		DE_UNREF(m_info);

		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
		{
			const Vec2	vColor		= rr::readVarying<float>(packet, context, 0, fragNdx).xy();
			const float	values[]	=
			{
				vColor.x(),
				vColor.y(),
				(1.0f - vColor.x()),
				(1.0f - vColor.y())
			};

			switch (tcu::getTextureChannelClass(m_info.getFormat().type))
			{
				case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
				case tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
				case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
				{
					const Vec4 color (values[(m_drawBufferNdx + 0) % 4],
									  values[(m_drawBufferNdx + 1) % 4],
									  values[(m_drawBufferNdx + 2) % 4],
									  values[(m_drawBufferNdx + 3) % 4]);

					rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
					break;
				}

				case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
				{
					const UVec4 color ((deUint32)(values[(m_drawBufferNdx + 0) % 4]),
									   (deUint32)(values[(m_drawBufferNdx + 1) % 4]),
									   (deUint32)(values[(m_drawBufferNdx + 2) % 4]),
									   (deUint32)(values[(m_drawBufferNdx + 3) % 4]));

					rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
					break;
				}

				case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
				{
					const IVec4 color ((deInt32)(values[(m_drawBufferNdx + 0) % 4]),
									   (deInt32)(values[(m_drawBufferNdx + 1) % 4]),
									   (deInt32)(values[(m_drawBufferNdx + 2) % 4]),
									   (deInt32)(values[(m_drawBufferNdx + 3) % 4]));

					rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
					break;
				}

				default:
					DE_ASSERT(DE_FALSE);
			};
		}
	}
}